

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree_main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  __pid_t _Var3;
  long *plVar4;
  ostream *poVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  vw_exception *this;
  char *__buf;
  stringstream __msg;
  SpanningTree spanningTree;
  string sStack_348;
  long local_328;
  filebuf local_320 [8];
  ostream local_318 [232];
  ios_base local_230 [264];
  SpanningTree local_128 [11];
  
  if (2 < argc) {
    poVar5 = std::operator<<((ostream *)&std::cout,"usage: spanning_tree [--nondaemon | pid_file]");
    std::endl<char,std::char_traits<char>>(poVar5);
    exit(0);
  }
  if (argc == 2) {
    iVar2 = strcmp("--nondaemon",argv[1]);
    if (iVar2 == 0) goto LAB_001047e7;
  }
  iVar2 = daemon(1,1);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_328);
    std::__ostream_insert<char,std::char_traits<char>>(local_318,"daemon: ",8);
    piVar6 = __errno_location();
    __buf = &local_128[0].m_stop;
    pcVar7 = strerror_r(*piVar6,__buf,0x100);
    if (pcVar7 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_318,"errno = ",8);
      sVar8 = strlen(__buf);
    }
    else {
      sVar8 = 0xf;
      __buf = "errno = unknown";
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_318,__buf,sVar8);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/cluster/spanning_tree_main.cc"
               ,0x29,&sStack_348);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
LAB_001047e7:
  VW::SpanningTree::SpanningTree(local_128,0x67af);
  if (argc == 2) {
    iVar2 = strcmp("--nondaemon",argv[1]);
    if (iVar2 != 0) {
      std::ofstream::ofstream(&local_328);
      std::ofstream::open((char *)&local_328,(_Ios_Openmode)argv[1]);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"error writing pid file",0x16);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        exit(1);
      }
      _Var3 = getpid();
      plVar4 = (long *)std::ostream::operator<<((ostream *)&local_328,_Var3);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      std::ofstream::close();
      local_328 = _VTT;
      *(undefined8 *)(local_320 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
      std::filebuf::~filebuf(local_320);
      std::ios_base::~ios_base(local_230);
    }
  }
  VW::SpanningTree::Run(local_128);
  VW::SpanningTree::~SpanningTree(local_128);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{ if (argc > 2)
  { cout << "usage: spanning_tree [--nondaemon | pid_file]" << endl;
    exit(0);
  }

  try
  { if (argc == 2 && strcmp("--nondaemon",argv[1])==0)
      ;
    else if (daemon(1,1))
      THROWERRNO("daemon: ");

    SpanningTree spanningTree;

    if (argc == 2 && strcmp("--nondaemon",argv[1])!=0)
    { ofstream pid_file;
      pid_file.open(argv[1]);
      if (!pid_file.is_open())
      { cerr << "error writing pid file" << endl;
        exit(1);
      }
      pid_file << getpid() << endl;
      pid_file.close();
    }

    spanningTree.Run();
  }
  catch (VW::vw_exception& e)
  { cerr << "spanning tree (" << e.Filename() << ":" << e.LineNumber() << "): " << e.what() << endl;
  }
}